

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_artifact_name(parser *p)

{
  byte *pbVar1;
  char *pcVar2;
  void *pvVar3;
  undefined8 *v;
  long lVar4;
  
  pcVar2 = parser_getstr(p,"name");
  pvVar3 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x140);
  v[3] = pvVar3;
  parser_setpriv(p,v);
  pcVar2 = string_make(pcVar2);
  *v = pcVar2;
  lVar4 = 0;
  do {
    pbVar1 = (byte *)((long)v + lVar4 * 4 + 0x92);
    *pbVar1 = *pbVar1 | 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_artifact_name(struct parser *p) {
	size_t i;
	const char *name = parser_getstr(p, "name");
	struct artifact *h = parser_priv(p);

	struct artifact *a = mem_zalloc(sizeof *a);
	a->next = h;
	parser_setpriv(p, a);
	a->name = string_make(name);

	/* Ignore all base elements */
	for (i = ELEM_BASE_MIN; i < ELEM_HIGH_MIN; i++) {
		a->el_info[i].flags |= EL_INFO_IGNORE;
	}

	return PARSE_ERROR_NONE;
}